

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InlinePass::GenInlineCode
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars,iterator *call_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr)

{
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar1;
  pointer pIVar2;
  Function *calleeFn;
  pointer puVar3;
  BasicBlock *this_00;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  int iVar9;
  uint32_t uVar10;
  uint32_t resultId;
  mapped_type *ppFVar11;
  mapped_type *pmVar12;
  Instruction *pIVar13;
  TypeManager *this_01;
  Type *pTVar14;
  undefined4 extraout_var;
  mapped_type *ppBVar15;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *blk;
  pointer puVar16;
  InlinePass *pIVar17;
  DebugInlinedAtContext *inlined_at_ctx_00;
  Instruction *line_inst;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr_00;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_blk_ptr
  ;
  uint32_t entry_blk_label_id;
  Instruction *local_188;
  undefined1 local_180 [16];
  code *local_170;
  code *local_168;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  single_trip_loop_cont_blk;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  callee2caller;
  iterator local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  DebugInlinedAtContext inlined_at_ctx;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  preCallSB;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  postCallSB;
  
  call_block_itr_00.iterator_ = call_block_itr.iterator_._M_current;
  callee2caller._M_h._M_buckets = &callee2caller._M_h._M_single_bucket;
  callee2caller._M_h._M_bucket_count = 1;
  callee2caller._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  callee2caller._M_h._M_element_count = 0;
  callee2caller._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  callee2caller._M_h._M_rehash_policy._M_next_resize = 0;
  callee2caller._M_h._M_single_bucket = (__node_base_ptr)0x0;
  preCallSB._M_h._M_buckets = &preCallSB._M_h._M_single_bucket;
  preCallSB._M_h._M_bucket_count = 1;
  preCallSB._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  preCallSB._M_h._M_element_count = 0;
  preCallSB._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  preCallSB._M_h._M_rehash_policy._M_next_resize = 0;
  preCallSB._M_h._M_single_bucket = (__node_base_ptr)0x0;
  postCallSB._M_h._M_buckets = &postCallSB._M_h._M_single_bucket;
  postCallSB._M_h._M_bucket_count = 1;
  postCallSB._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  postCallSB._M_h._M_element_count = 0;
  postCallSB._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  postCallSB._M_h._M_rehash_policy._M_next_resize = 0;
  postCallSB._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar13 = (call_inst_itr->super_iterator).node_;
  pIVar2 = (pIVar13->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = false;
  inlined_at_ctx.call_inst_line_ = (pointer)0x0;
  if (pIVar2 != (pIVar13->dbg_line_insts_).
                super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    inlined_at_ctx.call_inst_line_ = pIVar2;
  }
  inlined_at_ctx.callee_inlined_at2chain_._M_h._M_buckets =
       &inlined_at_ctx.callee_inlined_at2chain_._M_h._M_single_bucket;
  inlined_at_ctx.call_inst_scope_ = pIVar13->dbg_scope_;
  inlined_at_ctx.callee_inlined_at2chain_._M_h._M_bucket_count = 1;
  inlined_at_ctx.callee_inlined_at2chain_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  inlined_at_ctx.callee_inlined_at2chain_._M_h._M_element_count = 0;
  inlined_at_ctx.callee_inlined_at2chain_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  inlined_at_ctx.callee_inlined_at2chain_._M_h._M_rehash_policy._M_next_resize = 0;
  inlined_at_ctx.callee_inlined_at2chain_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  IRContext::InvalidateAnalyses((this->super_Pass).context_,kAnalysisBegin);
  local_188 = BasicBlock::GetLoopMergeInst
                        (((call_block_itr_00.iterator_._M_current)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  single_trip_loop_cont_blk._M_t.
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
        )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          )0x0;
  pIVar17 = (InlinePass *)&this->id2function_;
  local_180._0_4_ = Instruction::GetSingleWordOperand((call_inst_itr->super_iterator).node_,2);
  ppFVar11 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)pIVar17,(key_type *)local_180);
  calleeFn = *ppFVar11;
  local_108._24_8_ = (call_inst_itr->super_iterator).node_;
  MapParams(pIVar17,calleeFn,(iterator *)(local_108 + 0x18),&callee2caller);
  inlined_at_ctx_00 = &inlined_at_ctx;
  bVar6 = CloneAndMapLocals(this,calleeFn,new_vars,&callee2caller,inlined_at_ctx_00);
  if (!bVar6) goto LAB_001f5476;
  entry_blk_label_id =
       Instruction::result_id
                 (*(Instruction **)
                   ((long)(((calleeFn->blocks_).
                            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ._M_t + 8));
  uVar8 = BasicBlock::id(((call_block_itr_00.iterator_._M_current)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  pmVar12 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&callee2caller,&entry_blk_label_id);
  *pmVar12 = uVar8;
  BasicBlock::id(((call_block_itr_00.iterator_._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  NewLabel((InlinePass *)local_180,(uint32_t)this);
  MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)&new_blk_ptr,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)local_180);
  pIVar17 = (InlinePass *)local_180._0_8_;
  if ((InlinePass *)local_180._0_8_ != (InlinePass *)0x0) {
    (**(code **)(*(long *)local_180._0_8_ + 8))();
  }
  pvVar1 = &calleeFn->blocks_;
  local_108._16_8_ = (call_inst_itr->super_iterator).node_;
  call_block_itr_00.container_ = (UptrVector *)inlined_at_ctx_00;
  MoveInstsBeforeEntryBlock
            (pIVar17,&preCallSB,
             (BasicBlock *)
             new_blk_ptr._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
             (iterator *)(local_108 + 0x10),call_block_itr_00);
  if (local_188 == (Instruction *)0x0) {
LAB_001f5102:
    uVar8 = Function::type_id(calleeFn);
    this_01 = IRContext::get_type_mgr((this->super_Pass).context_);
    pTVar14 = analysis::TypeManager::GetType(this_01,uVar8);
    iVar9 = (*pTVar14->_vptr_Type[5])(pTVar14);
    uVar10 = 0;
    if (CONCAT44(extraout_var,iVar9) == 0) {
      uVar10 = CreateReturnVar(this,calleeFn,new_vars);
      if (uVar10 != 0) goto LAB_001f514b;
    }
    else {
LAB_001f514b:
      local_180._0_8_ = &callee2caller;
      local_168 = std::
                  _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:637:27)>
                  ::_M_invoke;
      local_170 = std::
                  _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:637:27)>
                  ::_M_manager;
      local_180._8_8_ = this;
      Function::WhileEachInst
                (calleeFn,(function<bool_(spvtools::opt::Instruction_*)> *)local_180,false,false);
      if (local_170 != (code *)0x0) {
        (*local_170)(local_180,local_180,3);
      }
      local_180._8_8_ = (void *)0x0;
      local_180._0_8_ = operator_new(0x20);
      (((InlinePass *)local_180._0_8_)->super_Pass)._vptr_Pass = (_func_int **)&new_blk_ptr;
      *(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        **)&(((InlinePass *)local_180._0_8_)->super_Pass).consumer_.super__Function_base._M_functor
           = &callee2caller;
      *(DebugInlinedAtContext **)
       ((long)&(((InlinePass *)local_180._0_8_)->super_Pass).consumer_.super__Function_base.
               _M_functor + 8) = &inlined_at_ctx;
      (((InlinePass *)local_180._0_8_)->super_Pass).consumer_.super__Function_base._M_manager =
           (_Manager_type)this;
      local_168 = std::
                  _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:650:7)>
                  ::_M_invoke;
      local_170 = std::
                  _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:650:7)>
                  ::_M_manager;
      Function::ForEachDebugInstructionsInHeader
                (calleeFn,(function<void_(spvtools::opt::Instruction_*)> *)local_180);
      if (local_170 != (code *)0x0) {
        (*local_170)(local_180,local_180,3);
      }
      callee_first_block.iterator_._M_current =
           (pvVar1->
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      callee_first_block.container_ = pvVar1;
      bVar7 = InlineEntryBlock(this,&callee2caller,&new_blk_ptr,callee_first_block,&inlined_at_ctx);
      if (bVar7) {
        local_108._0_8_ =
             new_blk_ptr._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        new_blk_ptr._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
             (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
              )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                )0x0;
        InlineBasicBlocks((InlinePass *)local_180,
                          (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                   *)new_blocks,
                          (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           *)&callee2caller,(DebugInlinedAtContext *)local_108,
                          (Function *)&inlined_at_ctx);
        uVar5 = local_180._0_8_;
        local_180._0_8_ = (InlinePass *)0x0;
        std::
        __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&new_blk_ptr,(pointer)uVar5);
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)local_180);
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)local_108);
        uVar4 = new_blk_ptr;
        if ((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             )new_blk_ptr._M_t.
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             )0x0) {
          new_blk_ptr._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
               (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  )0x0;
          local_118._8_8_ =
               uVar4._M_t.
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          BasicBlock::tail((BasicBlock *)local_118);
          InlineReturn((InlinePass *)local_180,
                       (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)this,(vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                *)&callee2caller,
                       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)new_blocks,(DebugInlinedAtContext *)(local_118 + 8),
                       (Function *)&inlined_at_ctx,(Instruction *)calleeFn,local_118._0_4_);
          uVar5 = local_180._0_8_;
          local_180._0_8_ = (InlinePass *)0x0;
          std::
          __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)&new_blk_ptr,(pointer)uVar5);
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)local_180);
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)(local_118 + 8));
          if (uVar10 != 0) {
            resultId = Instruction::result_id((call_inst_itr->super_iterator).node_);
            if (resultId == 0) {
              __assert_fail("resId != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                            ,0x2a4,
                            "bool spvtools::opt::InlinePass::GenInlineCode(std::vector<std::unique_ptr<BasicBlock>> *, std::vector<std::unique_ptr<Instruction>> *, BasicBlock::iterator, UptrVectorIterator<BasicBlock>)"
                           );
            }
            pIVar13 = (call_inst_itr->super_iterator).node_;
            pIVar2 = (pIVar13->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            line_inst = (Instruction *)0x0;
            if (pIVar2 != (pIVar13->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              line_inst = pIVar2;
            }
            AddLoad(this,uVar8,resultId,uVar10,&new_blk_ptr,line_inst,&pIVar13->dbg_scope_);
          }
          local_120.node_ = (call_inst_itr->super_iterator).node_;
          bVar7 = MoveCallerInstsAfterFunctionCall
                            (this,&preCallSB,&postCallSB,&new_blk_ptr,(iterator *)&local_120,
                             (calleeFn->blocks_).
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start !=
                             (calleeFn->blocks_).
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          if (bVar7) {
            std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
            ::
            emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                      ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                        *)new_blocks,&new_blk_ptr);
            if ((local_188 != (Instruction *)0x0) &&
               (8 < (ulong)((long)(new_blocks->
                                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(new_blocks->
                                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start))) {
              MoveLoopMergeInstToFirstBlock(this,new_blocks);
              puVar16 = (new_blocks->
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pIVar13 = BasicBlock::GetLoopMergeInst
                                  ((BasicBlock *)
                                   (puVar16->_M_t).
                                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                   ._M_t);
              uVar8 = Instruction::GetSingleWordInOperand(pIVar13,1);
              uVar10 = BasicBlock::id((BasicBlock *)
                                      (puVar16->_M_t).
                                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                      ._M_t);
              if (uVar8 == uVar10) {
                uVar8 = IRContext::TakeNextId((this->super_Pass).context_);
                if (uVar8 == 0) goto LAB_001f5469;
                UpdateSingleBlockLoopContinueTarget(this,uVar8,new_blocks);
              }
            }
            puVar3 = (new_blocks->
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (puVar16 = (new_blocks->
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar3;
                puVar16 = puVar16 + 1) {
              this_00 = (puVar16->_M_t).
                        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
              uVar8 = BasicBlock::id(this_00);
              local_180._0_4_ = uVar8;
              ppBVar15 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&this->id2block_,(key_type *)local_180);
              *ppBVar15 = this_00;
            }
            IRContext::KillNamesAndDecorates
                      ((this->super_Pass).context_,(call_inst_itr->super_iterator).node_);
            bVar7 = true;
            goto LAB_001f546c;
          }
        }
      }
    }
LAB_001f5469:
    bVar7 = false;
  }
  else {
    pIVar13 = BasicBlock::GetMergeInst
                        ((BasicBlock *)
                         (((pvVar1->
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t);
    if (pIVar13 == (Instruction *)0x0) goto LAB_001f5102;
    local_108._8_8_ =
         new_blk_ptr._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    new_blk_ptr._M_t.
    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
          )(__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            )0x0;
    AddGuardBlock((InlinePass *)local_180,
                  (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)new_blocks,
                  (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)&callee2caller,
                  (uint32_t)
                  (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)(local_108 + 8));
    uVar5 = local_180._0_8_;
    local_180._0_8_ = (InlinePass *)0x0;
    std::__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             *)&new_blk_ptr,(pointer)uVar5);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)local_180);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)(local_108 + 8));
    bVar7 = false;
    if ((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )new_blk_ptr._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        )0x0) goto LAB_001f5102;
  }
LAB_001f546c:
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&new_blk_ptr);
LAB_001f5476:
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&single_trip_loop_cont_blk);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&inlined_at_ctx.callee_inlined_at2chain_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&postCallSB._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&preCallSB._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&callee2caller._M_h);
  return bVar7;
}

Assistant:

bool InlinePass::GenInlineCode(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::vector<std::unique_ptr<Instruction>>* new_vars,
    BasicBlock::iterator call_inst_itr,
    UptrVectorIterator<BasicBlock> call_block_itr) {
  // Map from all ids in the callee to their equivalent id in the caller
  // as callee instructions are copied into caller.
  std::unordered_map<uint32_t, uint32_t> callee2caller;
  // Pre-call same-block insts
  std::unordered_map<uint32_t, Instruction*> preCallSB;
  // Post-call same-block op ids
  std::unordered_map<uint32_t, uint32_t> postCallSB;

  analysis::DebugInlinedAtContext inlined_at_ctx(&*call_inst_itr);

  // Invalidate the def-use chains.  They are not kept up to date while
  // inlining.  However, certain calls try to keep them up-to-date if they are
  // valid.  These operations can fail.
  context()->InvalidateAnalyses(IRContext::kAnalysisDefUse);

  // If the caller is a loop header and the callee has multiple blocks, then the
  // normal inlining logic will place the OpLoopMerge in the last of several
  // blocks in the loop.  Instead, it should be placed at the end of the first
  // block.  We'll wait to move the OpLoopMerge until the end of the regular
  // inlining logic, and only if necessary.
  bool caller_is_loop_header = call_block_itr->GetLoopMergeInst() != nullptr;

  // Single-trip loop continue block
  std::unique_ptr<BasicBlock> single_trip_loop_cont_blk;

  Function* calleeFn = id2function_[call_inst_itr->GetSingleWordOperand(
      kSpvFunctionCallFunctionId)];

  // Map parameters to actual arguments.
  MapParams(calleeFn, call_inst_itr, &callee2caller);

  // Define caller local variables for all callee variables and create map to
  // them.
  if (!CloneAndMapLocals(calleeFn, new_vars, &callee2caller, &inlined_at_ctx)) {
    return false;
  }

  // First block needs to use label of original block
  // but map callee label in case of phi reference.
  uint32_t entry_blk_label_id = calleeFn->begin()->GetLabelInst()->result_id();
  callee2caller[entry_blk_label_id] = call_block_itr->id();
  std::unique_ptr<BasicBlock> new_blk_ptr =
      MakeUnique<BasicBlock>(NewLabel(call_block_itr->id()));

  // Move instructions of original caller block up to call instruction.
  MoveInstsBeforeEntryBlock(&preCallSB, new_blk_ptr.get(), call_inst_itr,
                            call_block_itr);

  if (caller_is_loop_header &&
      (*(calleeFn->begin())).GetMergeInst() != nullptr) {
    // We can't place both the caller's merge instruction and
    // another merge instruction in the same block.  So split the
    // calling block. Insert an unconditional branch to a new guard
    // block.  Later, once we know the ID of the last block,  we
    // will move the caller's OpLoopMerge from the last generated
    // block into the first block. We also wait to avoid
    // invalidating various iterators.
    new_blk_ptr = AddGuardBlock(new_blocks, &callee2caller,
                                std::move(new_blk_ptr), entry_blk_label_id);
    if (new_blk_ptr == nullptr) return false;
  }

  // Create return var if needed.
  const uint32_t calleeTypeId = calleeFn->type_id();
  uint32_t returnVarId = 0;
  analysis::Type* calleeType = context()->get_type_mgr()->GetType(calleeTypeId);
  if (calleeType->AsVoid() == nullptr) {
    returnVarId = CreateReturnVar(calleeFn, new_vars);
    if (returnVarId == 0) {
      return false;
    }
  }

  calleeFn->WhileEachInst([&callee2caller, this](const Instruction* cpi) {
    // Create set of callee result ids. Used to detect forward references
    const uint32_t rid = cpi->result_id();
    if (rid != 0 && callee2caller.find(rid) == callee2caller.end()) {
      const uint32_t nid = context()->TakeNextId();
      if (nid == 0) return false;
      callee2caller[rid] = nid;
    }
    return true;
  });

  // Inline DebugClare instructions in the callee's header.
  calleeFn->ForEachDebugInstructionsInHeader(
      [&new_blk_ptr, &callee2caller, &inlined_at_ctx, this](Instruction* inst) {
        InlineSingleInstruction(
            callee2caller, new_blk_ptr.get(), inst,
            context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                inst->GetDebugScope().GetInlinedAt(), &inlined_at_ctx));
      });

  // Inline the entry block of the callee function.
  if (!InlineEntryBlock(callee2caller, &new_blk_ptr, calleeFn->begin(),
                        &inlined_at_ctx)) {
    return false;
  }

  // Inline blocks of the callee function other than the entry block.
  new_blk_ptr =
      InlineBasicBlocks(new_blocks, callee2caller, std::move(new_blk_ptr),
                        &inlined_at_ctx, calleeFn);
  if (new_blk_ptr == nullptr) return false;

  new_blk_ptr = InlineReturn(callee2caller, new_blocks, std::move(new_blk_ptr),
                             &inlined_at_ctx, calleeFn,
                             &*(calleeFn->tail()->tail()), returnVarId);

  // Load return value into result id of call, if it exists.
  if (returnVarId != 0) {
    const uint32_t resId = call_inst_itr->result_id();
    assert(resId != 0);
    AddLoad(calleeTypeId, resId, returnVarId, &new_blk_ptr,
            call_inst_itr->dbg_line_inst(), call_inst_itr->GetDebugScope());
  }

  // Move instructions of original caller block after call instruction.
  if (!MoveCallerInstsAfterFunctionCall(&preCallSB, &postCallSB, &new_blk_ptr,
                                        call_inst_itr,
                                        calleeFn->begin() != calleeFn->end()))
    return false;

  // Finalize inline code.
  new_blocks->push_back(std::move(new_blk_ptr));

  if (caller_is_loop_header && (new_blocks->size() > 1)) {
    MoveLoopMergeInstToFirstBlock(new_blocks);

    // If the loop was a single basic block previously, update it's structure.
    auto& header = new_blocks->front();
    auto* merge_inst = header->GetLoopMergeInst();
    if (merge_inst->GetSingleWordInOperand(1u) == header->id()) {
      auto new_id = context()->TakeNextId();
      if (new_id == 0) return false;
      UpdateSingleBlockLoopContinueTarget(new_id, new_blocks);
    }
  }

  // Update block map given replacement blocks.
  for (auto& blk : *new_blocks) {
    id2block_[blk->id()] = &*blk;
  }

  // We need to kill the name and decorations for the call, which will be
  // deleted.
  context()->KillNamesAndDecorates(&*call_inst_itr);

  return true;
}